

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_platform_macros.h
# Opt level: O0

UWORD32 CTZ(UWORD32 u4_word)

{
  uint index;
  UWORD32 u4_word_local;
  undefined4 local_4;
  
  if (u4_word == 0) {
    local_4 = 0x1f;
  }
  else {
    local_4 = 0;
    for (; (u4_word & 1) == 0; u4_word = u4_word >> 1 | 0x80000000) {
      local_4 = local_4 + 1;
    }
  }
  return local_4;
}

Assistant:

static INLINE UWORD32 CTZ(UWORD32 u4_word)
{
    if(0 == u4_word)
        return 31;
    else
    {
        unsigned int index;
        index = __builtin_ctz(u4_word);
        return (UWORD32)index;
    }
}